

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O1

CodeLocation __thiscall
soul::SimpleTokeniser::findNext(SimpleTokeniser *this,CodeLocation *start,TokenType target)

{
  TokenType __s1;
  int iVar1;
  char *extraout_RDX;
  char *extraout_RDX_00;
  UTF8Reader UVar2;
  bool bVar3;
  CodeLocation CVar4;
  SimpleTokeniser tokeniser;
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  TStack_a8;
  
  SimpleTokeniser((SimpleTokeniser *)&TStack_a8,start,true);
  while( true ) {
    __s1.text = TStack_a8.currentType.text;
    if (TStack_a8.currentType.text == "$eof") {
      bVar3 = true;
    }
    else if (TStack_a8.currentType.text == (char *)0x0) {
      bVar3 = false;
    }
    else {
      iVar1 = strcmp(TStack_a8.currentType.text,"$eof");
      bVar3 = iVar1 == 0;
    }
    if (bVar3) break;
    if ((__s1.text == target.text) ||
       ((__s1.text != (char *)0x0 && target.text != (char *)0x0 &&
        (iVar1 = strcmp(__s1.text,target.text), iVar1 == 0)))) {
      (this->super_SOULTokeniser)._vptr_Tokeniser =
           (_func_int **)TStack_a8.location.sourceCode.object;
      if (TStack_a8.location.sourceCode.object != (SourceCodeText *)0x0) {
        ((TStack_a8.location.sourceCode.object)->super_RefCountedObject).refCount =
             ((TStack_a8.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
      }
      (this->super_SOULTokeniser).startLocation.sourceCode.object =
           (SourceCodeText *)TStack_a8.location.location.data;
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::~Tokeniser(&TStack_a8);
      UVar2.data = extraout_RDX;
LAB_001c8ac9:
      CVar4.location.data = UVar2.data;
      CVar4.sourceCode.object = (SourceCodeText *)this;
      return CVar4;
    }
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::skip(&TStack_a8);
  }
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::~Tokeniser(&TStack_a8);
  (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)0x0;
  (this->super_SOULTokeniser).startLocation.sourceCode.object = (SourceCodeText *)0x0;
  UVar2.data = extraout_RDX_00;
  goto LAB_001c8ac9;
}

Assistant:

static CodeLocation findNext (CodeLocation start, TokenType target)
    {
        try
        {
            SimpleTokeniser tokeniser (start, true);

            while (! tokeniser.matches (Token::eof))
            {
                if (tokeniser.matches (target))
                    return tokeniser.location;

                tokeniser.skip();
            }
        }
        catch (const AbortCompilationException&) {}

        return {};
    }